

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

int stringmap_insert(StringMap *smap,char *key,char *value)

{
  MOJOSHADER_malloc p_Var1;
  size_t sVar2;
  char *__dest;
  bool local_62;
  char *local_58;
  int failed;
  char *v;
  char *k;
  int rc;
  char *value_local;
  char *key_local;
  StringMap *smap_local;
  
  if (key != (char *)0x0) {
    if (smap->nuke == stringmap_nuke_noop) {
      smap_local._4_4_ = hash_insert(smap,key,value);
    }
    else {
      k._4_4_ = -1;
      p_Var1 = smap->m;
      sVar2 = strlen(key);
      __dest = (char *)(*p_Var1)((int)sVar2 + 1,smap->d);
      if (value == (char *)0x0) {
        local_58 = (char *)0x0;
      }
      else {
        p_Var1 = smap->m;
        sVar2 = strlen(value);
        local_58 = (char *)(*p_Var1)((int)sVar2 + 1,smap->d);
      }
      local_62 = true;
      if (__dest != (char *)0x0) {
        local_62 = local_58 == (char *)0x0 && value != (char *)0x0;
      }
      if (!local_62) {
        strcpy(__dest,key);
        if (value != (char *)0x0) {
          strcpy(local_58,value);
        }
        k._4_4_ = hash_insert(smap,__dest,local_58);
        local_62 = k._4_4_ < 1;
      }
      if (local_62) {
        (*smap->f)(__dest,smap->d);
        (*smap->f)(local_58,smap->d);
      }
      smap_local._4_4_ = k._4_4_;
    }
    return smap_local._4_4_;
  }
  __assert_fail("key != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                ,0x124,"int stringmap_insert(StringMap *, const char *, const char *)");
}

Assistant:

int stringmap_insert(StringMap *smap, const char *key, const char *value)
{
    assert(key != NULL);
    if (smap->nuke == stringmap_nuke_noop)  // no copy?
        return hash_insert(smap, key, value);

    int rc = -1;
    char *k = (char *) smap->m(strlen(key) + 1, smap->d);
    char *v = (char *) (value ? smap->m(strlen(value) + 1, smap->d) : NULL);
    int failed = ( (!k) || ((!v) && (value)) );

    if (!failed)
    {
        strcpy(k, key);
        if (value != NULL)
            strcpy(v, value);
        failed = ((rc = hash_insert(smap, k, v)) <= 0);
    } // if

    if (failed)
    {
        smap->f(k, smap->d);
        smap->f(v, smap->d);
    } // if

    return rc;
}